

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KRef_Ptr.h
# Opt level: O0

void __thiscall
KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FactoryDecoder<KDIS::DATA_TYPE::EnvironmentRecord>_>::unRef
          (KRef_Ptr<KDIS::DATA_TYPE::FactoryDecoder<KDIS::DATA_TYPE::EnvironmentRecord>_> *this)

{
  KRef_Ptr<KDIS::DATA_TYPE::FactoryDecoder<KDIS::DATA_TYPE::EnvironmentRecord>_> *this_local;
  
  if ((this->m_pRef != (FactoryDecoder<KDIS::DATA_TYPE::EnvironmentRecord> *)0x0) &&
     (*this->m_piCount = *this->m_piCount - 1, *this->m_piCount == 0)) {
    if (this->m_piCount != (RefCounter *)0x0) {
      operator_delete(this->m_piCount,2);
    }
    if (this->m_pRef != (FactoryDecoder<KDIS::DATA_TYPE::EnvironmentRecord> *)0x0) {
      (**(code **)(*(long *)this->m_pRef + 8))();
    }
    this->m_piCount = (RefCounter *)0x0;
    this->m_pRef = (FactoryDecoder<KDIS::DATA_TYPE::EnvironmentRecord> *)0x0;
  }
  return;
}

Assistant:

void unRef()
    {
        if( m_pRef )
        {
            --( *m_piCount );
            if( *m_piCount == 0 )
            {
                delete m_piCount;
                delete m_pRef;
                m_piCount = NULL;
                m_pRef = NULL;
            }
        }
    }